

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

char * uplevel(void)

{
  size_t sVar1;
  size_t sVar2;
  int nlen;
  int olen;
  char *cptr;
  
  if (pathname == (char *)0x0) {
    cptr = (char *)0x0;
  }
  else {
    sVar1 = strlen(pathname);
    _nlen = pathname + (int)sVar1;
    do {
      _nlen = _nlen + -1;
      if (_nlen <= pathname) goto LAB_00105544;
    } while (*_nlen != '/');
    *_nlen = '\0';
LAB_00105544:
    if (_nlen == pathname) {
      free(pathname);
      pathname = (char *)0x0;
    }
    else {
      sVar2 = strlen(pathname);
      if ((int)sVar2 < (int)sVar1) {
        pathname = (char *)realloc(pathname,(long)((int)sVar2 + 1));
      }
    }
    cptr = pathname;
  }
  return cptr;
}

Assistant:

char *
uplevel()
{
	register char *cptr;
	register int olen, nlen;

	if (!pathname)
		return (NULL);

	olen = strlen(pathname);
	cptr = pathname + olen - 1;
	while (cptr > pathname)
		if (*cptr == PATHSEP)
		{
			*cptr = '\0';
			break;
		}
		else
			cptr--;

	if (cptr == pathname)
	{
		free(pathname);
		pathname = NULL;
	}
	else
	{
		nlen = strlen(pathname);
		if (nlen < olen)
			pathname = realloc(pathname, nlen + 1);
	}
	return (pathname);
}